

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O3

int32_t ll_scan_mode_get(ll_scan_mode *scan_mode)

{
  _Bool _Var1;
  uint uVar2;
  
  _Var1 = transport_mutex_grab();
  if (_Var1) {
    uVar2 = hal_read_write(OP_SCAN_MODE_GET,(uint8_t *)0x0,0,_ll_ifc_message_buff,1);
    *scan_mode = (uint)_ll_ifc_message_buff[0];
    transport_mutex_release();
    uVar2 = (int)uVar2 >> 0x1f & uVar2;
  }
  else {
    uVar2 = 0xffffff8f;
  }
  return uVar2;
}

Assistant:

int32_t ll_scan_mode_get(enum ll_scan_mode *scan_mode)
{
    uint8_t u8_scan_mode;

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    int32_t ret = hal_read_write(OP_SCAN_MODE_GET, NULL, 0, &_ll_ifc_message_buff[0], 1);

    *scan_mode = _ll_ifc_message_buff[0];

    transport_mutex_release();
    return (ret >= 0) ? LL_IFC_ACK : ret;
}